

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O2

void __thiscall Fl_Widget_Class_Type::write_code1(Fl_Widget_Class_Type *this)

{
  Fl_Widget *pFVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  current_widget_class = this;
  this->write_public_state = '\x01';
  pcVar2 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.subclass_;
  pcVar4 = "Fl_Group";
  if (pcVar2 != (char *)0x0) {
    pcVar4 = pcVar2;
  }
  Fl_Type::write_comment_h((Fl_Type *)this,"");
  write_h("\nclass %s : public %s {\n",
          (this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_,pcVar4);
  pcVar2 = strstr(pcVar4,"Window");
  if (pcVar2 == (char *)0x0) {
    write_h("public:\n");
    pcVar2 = trimclassname((this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_);
    write_h("  %s(int X, int Y, int W, int H, const char *L = 0);\n",pcVar2);
    pcVar2 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_;
    pcVar3 = trimclassname(pcVar2);
    write_c("%s::%s(int X, int Y, int W, int H, const char *L)\n",pcVar2,pcVar3);
    if (this->wc_relative == '\0') {
      pcVar2 = "  : %s(X, Y, W, H, L) {\n";
    }
    else {
      pcVar2 = "  : %s(0, 0, W, H, L) {\n";
    }
    write_c(pcVar2,pcVar4);
  }
  else {
    pcVar2 = trimclassname((this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_);
    write_h("  void _%s();\n",pcVar2);
    write_h("public:\n");
    pcVar2 = trimclassname((this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_);
    write_h("  %s(int X, int Y, int W, int H, const char *L = 0);\n",pcVar2);
    pcVar2 = trimclassname((this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_);
    write_h("  %s(int W, int H, const char *L = 0);\n",pcVar2);
    pcVar2 = trimclassname((this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_);
    write_h("  %s();\n",pcVar2);
    pcVar2 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_;
    pcVar3 = trimclassname(pcVar2);
    write_c("%s::%s(int X, int Y, int W, int H, const char *L)\n",pcVar2,pcVar3);
    write_c("  : %s(X, Y, W, H, L) {\n",pcVar4);
    pcVar2 = trimclassname((this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_);
    write_c("  _%s();\n",pcVar2);
    write_c("}\n\n");
    pcVar2 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_;
    pcVar3 = trimclassname(pcVar2);
    write_c("%s::%s(int W, int H, const char *L)\n",pcVar2,pcVar3);
    write_c("  : %s(0, 0, W, H, L) {\n",pcVar4);
    write_c("  clear_flag(16);\n");
    pcVar2 = trimclassname((this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_);
    write_c("  _%s();\n",pcVar2);
    write_c("}\n\n");
    pcVar2 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_;
    pcVar3 = trimclassname(pcVar2);
    write_c("%s::%s()\n",pcVar2,pcVar3);
    pFVar1 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.o;
    write_c("  : %s(0, 0, %d, %d, ",pcVar4,(ulong)(uint)pFVar1->w_,(ulong)(uint)pFVar1->h_);
    pcVar2 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.label_;
    if (pcVar2 == (char *)0x0) {
      write_c("0");
    }
    else {
      write_cstring(pcVar2);
    }
    write_c(") {\n");
    write_c("  clear_flag(16);\n");
    pcVar2 = trimclassname((this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_);
    write_c("  _%s();\n",pcVar2);
    write_c("}\n\n");
    pcVar2 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.name_;
    pcVar4 = trimclassname(pcVar2);
    write_c("void %s::_%s() {\n",pcVar2,pcVar4);
  }
  Fl_Widget_Type::write_widget_code((Fl_Widget_Type *)this);
  return;
}

Assistant:

void Fl_Widget_Class_Type::write_code1() {
#if 0
  Fl_Widget_Type::write_code1();
#endif // 0

  current_widget_class = this;
  write_public_state = 1;

  const char *c = subclass();
  if (!c) c = "Fl_Group";

  write_comment_h();
  write_h("\nclass %s : public %s {\n", name(), c);
  if (strstr(c, "Window")) {
    write_h("  void _%s();\n", trimclassname(name()));
    write_h("public:\n");
    write_h("  %s(int X, int Y, int W, int H, const char *L = 0);\n", trimclassname(name()));
    write_h("  %s(int W, int H, const char *L = 0);\n", trimclassname(name()));
    write_h("  %s();\n", trimclassname(name()));

    // a constructor with all four dimensions plus label
    write_c("%s::%s(int X, int Y, int W, int H, const char *L)\n", name(), trimclassname(name()));
    write_c("  : %s(X, Y, W, H, L) {\n", c);
    write_c("  _%s();\n", trimclassname(name()));
    write_c("}\n\n");

    // a constructor with just the size and label. The window manager will position the window
    write_c("%s::%s(int W, int H, const char *L)\n", name(), trimclassname(name()));
    write_c("  : %s(0, 0, W, H, L) {\n", c);
    write_c("  clear_flag(16);\n");
    write_c("  _%s();\n", trimclassname(name()));
    write_c("}\n\n");
    
    // a constructor that takes size and label from the Fluid database
    write_c("%s::%s()\n", name(), trimclassname(name()));
    write_c("  : %s(0, 0, %d, %d, ", c, o->w(), o->h());
    const char *cstr = label();
    if (cstr) write_cstring(cstr);
    else write_c("0");
    write_c(") {\n");
    write_c("  clear_flag(16);\n");
    write_c("  _%s();\n", trimclassname(name()));
    write_c("}\n\n");
    
    write_c("void %s::_%s() {\n", name(), trimclassname(name()));
//    write_c("  %s *w = this;\n", name());
  } else {
    write_h("public:\n");
    write_h("  %s(int X, int Y, int W, int H, const char *L = 0);\n", trimclassname(name()));

    write_c("%s::%s(int X, int Y, int W, int H, const char *L)\n", name(), trimclassname(name()));
    if (wc_relative)
      write_c("  : %s(0, 0, W, H, L) {\n", c);
    else
      write_c("  : %s(X, Y, W, H, L) {\n", c);
  }

//  write_c("  %s *o = this;\n", name());

  write_widget_code();
}